

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  socklen_t in_ECX;
  sockaddr *__addr;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Signal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_> sig_increment;
  code *local_48 [2];
  code *local_38;
  code *pcStack_30;
  
  printf("Signal/Basic Tests: ");
  BasicSignalTests::run();
  puts("OK");
  printf("Signal/CollectorVector: ");
  TestCollectorVector::run();
  puts("OK");
  printf("Signal/CollectorUntil0: ");
  TestCollectorUntil0::run();
  puts("OK");
  printf("Signal/CollectorWhile0: ");
  TestCollectorWhile0::run();
  puts("OK");
  printf("Signal/Benchmark: Simple::Signal: ");
  local_38 = (_Manager_type)0x0;
  pcStack_30 = (_Invoker_type)0x0;
  local_48[0] = (code *)0x0;
  local_48[1] = (code *)0x0;
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  ProtoSignal(&sig_increment.
               super_ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>
              ,(CbFunction *)local_48);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  local_48[1] = (code *)0x0;
  local_48[0] = TestCounter::add2;
  pcStack_30 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>
               ::_M_invoke;
  local_38 = std::_Function_handler<void_(void_*,_unsigned_long),_void_(*)(void_*,_unsigned_long)>::
             _M_manager;
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  connect(&sig_increment.
           super_ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>,
          (int)local_48,__addr,in_ECX);
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  lVar3 = (anonymous_namespace)::test_counter_var;
  lVar4 = 999999;
  uVar1 = timestamp_benchmark();
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
    emit(&sig_increment.
          super_ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>,
         (void *)0x0,1);
  }
  uVar2 = timestamp_benchmark();
  if ((anonymous_namespace)::test_counter_var - lVar3 != 999999) {
    __assert_fail("end_counter - start_counter == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                  ,0xbf,"void bench_simple_signal()");
  }
  lVar3 = uVar2 - uVar1;
  auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar6._0_8_ = lVar3;
  auVar6._12_4_ = 0x45300000;
  printf("OK\n  Benchmark: Simple::Signal: %fns per emission (size=%u): ",
         SUB84(((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 999999.0,0),8);
  Simple::Lib::ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>::
  ~ProtoSignal(&sig_increment.
                super_ProtoSignal<void_(void_*,_unsigned_long),_Simple::Lib::CollectorDefault<void>_>
              );
  puts("OK");
  printf("Signal/Benchmark: callback loop: ");
  lVar3 = (anonymous_namespace)::test_counter_var;
  lVar4 = 999999;
  uVar1 = timestamp_benchmark();
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    TestCounter::add2((void *)0x0,1);
  }
  uVar2 = timestamp_benchmark();
  if ((anonymous_namespace)::test_counter_var - lVar3 == 999999) {
    lVar3 = uVar2 - uVar1;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    printf("OK\n  Benchmark: callback loop: %fns per round: ",
           SUB84(((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 999999.0,0));
    puts("OK");
    return 0;
  }
  __assert_fail("end_counter - start_counter == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/test.cpp"
                ,0xd2,"void bench_callback_loop()");
}

Assistant:

int
main (int   argc,
      char *argv[])
{
  printf ("Signal/Basic Tests: ");
  BasicSignalTests::run();
  printf ("OK\n");

  printf ("Signal/CollectorVector: ");
  TestCollectorVector::run();
  printf ("OK\n");

  printf ("Signal/CollectorUntil0: ");
  TestCollectorUntil0::run();
  printf ("OK\n");

  printf ("Signal/CollectorWhile0: ");
  TestCollectorWhile0::run();
  printf ("OK\n");

  printf ("Signal/Benchmark: Simple::Signal: ");
  bench_simple_signal();
  printf ("OK\n");

  printf ("Signal/Benchmark: callback loop: ");
  bench_callback_loop();
  printf ("OK\n");

  return 0;
}